

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImGuiID id;
  char *str;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  ImRect bb;
  ImRect inner_rect;
  ImRect local_38;
  ImVec2 local_28;
  ImVec2 IStack_20;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  fVar6 = (this->Pos).x;
  fVar1 = (this->Pos).y;
  local_28 = (this->InnerRect).Min;
  IStack_20 = (this->InnerRect).Max;
  IVar2 = local_28;
  uVar3 = (uint)((&(this->ScrollbarSizes).x)[axis] <= 0.0) << 3;
  fVar5 = (&(this->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    fVar6 = (this->Size).y + fVar1;
    fVar5 = (fVar6 - this->WindowBorderSize) - fVar5;
    uVar4 = -(uint)(fVar5 <= fVar1);
    local_38.Min.y = (float)(uVar4 & (uint)fVar1 | ~uVar4 & (uint)fVar5);
    local_38.Min.x = local_28.x;
    local_38.Max.y = fVar6;
    local_38.Max.x = IStack_20.x;
    uVar3 = uVar3 | 4;
  }
  else {
    local_38.Max.x = (this->Size).x + fVar6;
    fVar5 = (local_38.Max.x - this->WindowBorderSize) - fVar5;
    uVar4 = -(uint)(fVar5 <= fVar6);
    local_38.Min.y = local_28.y;
    local_38.Min.x = (float)(uVar4 & (uint)fVar6 | ~uVar4 & (uint)fVar5);
    local_38.Max.y = (this->InnerRect).Max.y;
    uVar3 = uVar3 | (uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2;
  }
  fVar6 = (&(this->WindowPadding).x)[axis];
  local_28 = IVar2;
  ScrollbarEx(&local_38,id,axis,&(this->Scroll).x + axis,(&IStack_20.x)[axis] - (&local_28.x)[axis],
              fVar6 + fVar6 + (&(this->ContentSize).x)[axis],uVar3);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}